

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSimpleProperty::IfcSimpleProperty(IfcSimpleProperty *this,void **vtt)

{
  void **vtt_local;
  IfcSimpleProperty *this_local;
  
  IfcProperty::IfcProperty(&this->super_IfcProperty,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSimpleProperty,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSimpleProperty,_0UL> *)
             &(this->super_IfcProperty).field_0x58,vtt + 5);
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
                    [-3]) = vtt[7];
  *(void **)&(this->super_IfcProperty).field_0x58 = vtt[8];
  return;
}

Assistant:

IfcSimpleProperty() : Object("IfcSimpleProperty") {}